

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_tests3.cpp
# Opt level: O0

void __thiscall
iutest_typed_test_suite_p_name_TypeParamTest3_::StaticMul2<short>::Body(StaticMul2<short> *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_208;
  Fixed local_1c8;
  int local_40;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  StaticMul2<short> *this_local;
  
  TypeParamTest3<short>::value = 1;
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c = (int)TypeParamTest3<short>::value + (int)TypeParamTest3<short>::value;
  local_40 = (int)TypeParamTest3<short>::value << 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"TestFixture::value+TestFixture::value",
             "2*TestFixture::value",&local_3c,&local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/type_param_tests3.cpp"
               ,0x2d,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(TypeParamTest3, StaticMul2)
{
    TestFixture::value = 1;
    IUTEST_ASSERT_EQ(TestFixture::value+TestFixture::value, 2*TestFixture::value);
}